

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O2

Vector3 Vector3ClampValue(Vector3 v,float min,float max)

{
  float fVar1;
  float fVar3;
  float fVar4;
  float fVar5;
  Vector3 VVar6;
  undefined8 uVar2;
  
  fVar4 = v.z;
  uVar2 = v._0_8_;
  fVar1 = v.x;
  fVar3 = v.y;
  fVar5 = fVar4 * fVar4 + fVar1 * fVar1 + fVar3 * fVar3;
  if (0.0 < fVar5) {
    fVar5 = SQRT(fVar5);
    if (min <= fVar5) {
      if (fVar5 <= max) {
        fVar5 = 1.0;
      }
      else {
        fVar5 = max / fVar5;
      }
    }
    else {
      fVar5 = min / fVar5;
    }
    uVar2 = CONCAT44(fVar3 * fVar5,fVar1 * fVar5);
    fVar4 = fVar4 * fVar5;
  }
  VVar6.z = fVar4;
  VVar6.x = (float)(int)uVar2;
  VVar6.y = (float)(int)((ulong)uVar2 >> 0x20);
  return VVar6;
}

Assistant:

RMAPI Vector3 Vector3ClampValue(Vector3 v, float min, float max)
{
    Vector3 result = v;

    float length = (v.x*v.x) + (v.y*v.y) + (v.z*v.z);
    if (length > 0.0f)
    {
        length = sqrtf(length);

        float scale = 1;    // By default, 1 as the neutral element.
        if (length < min)
        {
            scale = min/length;
        }
        else if (length > max)
        {
            scale = max/length;
        }

        result.x = v.x*scale;
        result.y = v.y*scale;
        result.z = v.z*scale;
    }

    return result;
}